

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

void nn_chunk_free(void *p)

{
  uint32_t uVar1;
  nn_chunk *self;
  
  self = nn_chunk_getptr(p);
  uVar1 = nn_atomic_dec(&self->refcount,1);
  if (uVar1 < 2) {
    nn_putl((uint8_t *)((long)p + -4),0xbeadfeed);
    nn_atomic_term(&self->refcount);
    (*self->ffn)(self);
    return;
  }
  return;
}

Assistant:

void nn_chunk_free (void *p)
{
    struct nn_chunk *self;

    self = nn_chunk_getptr (p);

    /*  Decrement the reference count. Actual deallocation happens only if
        it drops to zero. */
    if (nn_atomic_dec (&self->refcount, 1) <= 1) {

        /*  Mark chunk as deallocated. */
        nn_putl ((uint8_t*) (((uint32_t*) p) - 1), NN_CHUNK_TAG_DEALLOCATED);

        /*  Deallocate the resources held by the chunk. */
        nn_atomic_term (&self->refcount);

        /*  Deallocate the memory block according to the allocation
            mechanism specified. */
        self->ffn (self);
    }
}